

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportItemSyntax,slang::parsing::Token,slang::syntax::AnsiPortListSyntax&>
          (BumpAllocator *this,Token *args,AnsiPortListSyntax *args_1)

{
  Token name;
  ModportItemSyntax *pMVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pMVar1 = (ModportItemSyntax *)allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  name.info = in_RSI;
  name._0_8_ = in_RDX;
  slang::syntax::ModportItemSyntax::ModportItemSyntax
            ((ModportItemSyntax *)in_RSI->location,name,(AnsiPortListSyntax *)in_RSI->rawTextPtr);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }